

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

Argument * __thiscall
argparse::ArgumentParser::operator[](ArgumentParser *this,string_view aArgumentName)

{
  bool bVar1;
  pointer ppVar2;
  reference pAVar3;
  logic_error *this_00;
  _Self local_30;
  _Self local_28;
  iterator tIterator;
  ArgumentParser *this_local;
  string_view aArgumentName_local;
  
  aArgumentName_local._M_len = (size_t)aArgumentName._M_str;
  this_local = (ArgumentParser *)aArgumentName._M_len;
  tIterator._M_node = (_Base_ptr)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
       ::find(&this->mArgumentMap,(key_type *)&this_local);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
       ::end(&this->mArgumentMap);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"No such argument");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
           ::operator->(&local_28);
  pAVar3 = std::_List_iterator<argparse::Argument>::operator*(&ppVar2->second);
  return pAVar3;
}

Assistant:

Argument &operator[](std::string_view aArgumentName) {
    auto tIterator = mArgumentMap.find(aArgumentName);
    if (tIterator != mArgumentMap.end()) {
      return *(tIterator->second);
    }
    throw std::logic_error("No such argument");
  }